

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
* wasm::getIgnorablePublicTypes(void)

{
  pointer pHVar1;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar2;
  __hashtable *__h;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *in_RDI;
  pointer pHVar3;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_68;
  byte local_50;
  uintptr_t local_48;
  HeapType type;
  TypeBuilder local_38;
  TypeBuilder builder;
  
  TypeBuilder::TypeBuilder(&local_38,2);
  local_68._0_8_ = 2;
  local_68._8_8_ = 0x100000001;
  TypeBuilder::setHeapType(&local_38,0,(Array *)&local_68._M_first);
  local_68._0_8_ = 2;
  local_68._8_8_ = 0x100000002;
  TypeBuilder::setHeapType(&local_38,1,(Array *)&local_68._M_first);
  TypeBuilder::build((BuildResult *)&local_68._M_first,&local_38);
  if (local_50 == 0) {
    (in_RDI->_M_h)._M_buckets = &(in_RDI->_M_h)._M_single_bucket;
    (in_RDI->_M_h)._M_bucket_count = 1;
    (in_RDI->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (in_RDI->_M_h)._M_element_count = 0;
    (in_RDI->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (in_RDI->_M_h)._M_rehash_policy._M_next_resize = 0;
    (in_RDI->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    pvVar2 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)&local_68._M_first);
    pHVar1 = (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pHVar3 = (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                  _M_impl.super__Vector_impl_data._M_start; pHVar3 != pHVar1; pHVar3 = pHVar3 + 1) {
      local_48 = pHVar3->id;
      std::
      _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                ();
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_50]._M_data)
              ((anon_class_1_0_00000001 *)&type,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&local_68._M_first);
    TypeBuilder::~TypeBuilder(&local_38);
    return in_RDI;
  }
  __assert_fail("result",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0xab2,"std::unordered_set<HeapType> wasm::getIgnorablePublicTypes()");
}

Assistant:

std::unordered_set<HeapType> getIgnorablePublicTypes() {
  auto array8 = Array(Field(Field::i8, Mutable));
  auto array16 = Array(Field(Field::i16, Mutable));
  TypeBuilder builder(2);
  builder[0] = array8;
  builder[1] = array16;
  auto result = builder.build();
  assert(result);
  std::unordered_set<HeapType> ret;
  for (auto type : *result) {
    ret.insert(type);
  }
  return ret;
}